

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O2

uint8_t pack_color_endpoints
                  (vfloat4 color0,vfloat4 color1,vfloat4 rgbs_color,vfloat4 rgbo_color,int format,
                  uint8_t *output,quant_method quant_level)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  byte bVar4;
  __m128i alVar5;
  uint8_t uVar6;
  bool bVar7;
  byte bVar8;
  uint8_t uVar9;
  int i;
  ulong uVar10;
  byte bVar11;
  uint *puVar12;
  longlong extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_03;
  longlong extraout_RDX_05;
  longlong extraout_RDX_07;
  longlong extraout_RDX_09;
  longlong extraout_RDX_11;
  longlong extraout_RDX_13;
  uint8_t i_1;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  vint4 *pvVar17;
  vint4 *in_R8;
  vint4 *in_R9;
  byte bVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  longlong lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  vfloat4 color0_00;
  vfloat4 color0_01;
  vfloat4 color0_02;
  vfloat4 uquant0;
  vfloat4 color;
  vfloat4 color_00;
  vfloat4 color0_03;
  vfloat4 color0_04;
  vfloat4 uquant0_00;
  vfloat4 color0_05;
  vfloat4 color0_06;
  vfloat4 color0_07;
  vfloat4 uquant0_01;
  vfloat4 color0_08;
  vfloat4 uquant0_02;
  vfloat4 color0_09;
  vfloat4 uquant0_03;
  vfloat4 color0_10;
  vfloat4 uquant0_04;
  vfloat4 color0_11;
  vfloat4 uquant0_05;
  vfloat4 color0_12;
  vfloat4 uquant0_06;
  vfloat4 color1_00;
  vfloat4 uquant1;
  vfloat4 color1_01;
  vfloat4 uquant1_00;
  vfloat4 color1_02;
  vfloat4 color1_03;
  vfloat4 uquant1_01;
  vfloat4 color1_04;
  vfloat4 uquant1_02;
  vfloat4 color1_05;
  vfloat4 uquant1_03;
  vfloat4 color1_06;
  vfloat4 uquant1_04;
  vfloat4 color1_07;
  vfloat4 uquant1_05;
  vfloat4 color1_08;
  vfloat4 uquant1_06;
  vint4 input0;
  vint4 quant0;
  vint4 vVar55;
  vint4 quant0_00;
  vint4 input0_00;
  vint4 quant0_01;
  vint4 input0_01;
  vint4 quant0_02;
  vint4 input0_02;
  vint4 quant0_03;
  vint4 input0_03;
  vint4 quant0_04;
  vint4 input0_04;
  vint4 quant0_05;
  vint4 input0_05;
  vint4 quant0_06;
  vint4 input1;
  vint4 quant1;
  vint4 input1_00;
  vint4 quant1_00;
  vint4 input1_01;
  vint4 quant1_01;
  vint4 input1_02;
  vint4 quant1_02;
  vint4 input1_03;
  vint4 quant1_03;
  vint4 input1_04;
  vint4 quant1_04;
  vint4 input1_05;
  vint4 quant1_05;
  vint4 input1_06;
  vint4 quant1_06;
  float local_188;
  float local_178;
  vint4 color1_out2;
  vint4 color0_out2;
  vint4 color0_out;
  vint4 color1_out;
  float a1_1;
  vint4 color1_unpack_1;
  vint4 color0_unpack_1;
  float a0_1;
  float local_a8;
  longlong extraout_RDX_00;
  longlong extraout_RDX_02;
  longlong extraout_RDX_04;
  longlong extraout_RDX_06;
  longlong extraout_RDX_08;
  longlong extraout_RDX_10;
  longlong extraout_RDX_12;
  longlong extraout_RDX_14;
  vint4 *pvVar18;
  float fVar32;
  float fVar38;
  float fVar52;
  float fVar54;
  
  auVar49._8_56_ = color1._16_56_;
  auVar49._0_8_ = color1.m._8_8_;
  lVar39 = color1.m._0_8_;
  auVar50._8_56_ = color0._16_56_;
  auVar50._0_8_ = color0.m._8_8_;
  auVar45._8_56_ = color0._8_56_;
  auVar45._0_8_ = color0.m._0_8_;
  uVar13 = quant_level - QUANT_6;
  if (0x10 < uVar13) {
    __assert_fail("QUANT_6 <= quant_level && quant_level <= QUANT_256",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_color_quantize.cpp"
                  ,0x77e,
                  "uint8_t pack_color_endpoints(vfloat4, vfloat4, vfloat4, vfloat4, int, uint8_t *, quant_method)"
                 );
  }
  uVar6 = '\0';
  if (0xf < (uint)format) {
    return '\0';
  }
  auVar41 = vmaxps_avx(auVar45._0_16_,ZEXT816(0) << 0x40);
  auVar51._8_4_ = 0x477fff00;
  auVar51._0_8_ = 0x477fff00477fff00;
  auVar51._12_4_ = 0x477fff00;
  auVar29 = vminps_avx(auVar41,auVar51);
  auVar41 = vmaxps_avx(auVar50._0_16_,ZEXT816(0) << 0x40);
  auVar41 = vminps_avx(auVar41,auVar51);
  fVar52 = auVar29._0_4_ * 0.0038910506;
  fVar54 = auVar29._4_4_ * 0.0038910506;
  auVar53 = CONCAT412(auVar29._12_4_ * 0.0038910506,
                      CONCAT48(auVar29._8_4_ * 0.0038910506,CONCAT44(fVar54,fVar52)));
  fVar32 = auVar41._0_4_ * 0.0038910506;
  fVar38 = auVar41._4_4_ * 0.0038910506;
  auVar33 = CONCAT412(auVar41._12_4_ * 0.0038910506,
                      CONCAT48(auVar41._8_4_ * 0.0038910506,CONCAT44(fVar38,fVar32)));
  puVar12 = &switchD_002613af::switchdataD_00320734;
  color0_00.m._0_8_ = auVar29._0_8_;
  color0_00.m._8_8_ = auVar41._0_8_;
  switch(format) {
  case 0:
    auVar41 = vhaddps_avx(auVar53,auVar53);
    auVar29 = vshufpd_avx(auVar53,auVar53,1);
    fVar32 = (auVar29._0_4_ + auVar41._0_4_) * 0.33333334;
    auVar41 = vhaddps_avx(auVar33,auVar33);
    auVar29 = vshufpd_avx(auVar33,auVar33,1);
    fVar38 = (auVar29._0_4_ + auVar41._0_4_) * 0.33333334;
    fVar52 = (fVar32 + fVar38) * 0.5;
    fVar54 = fVar52;
    if (fVar32 <= fVar38) {
      fVar54 = fVar38;
    }
    auVar41 = vcmpss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar32),1);
    auVar41 = vblendvps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar52),auVar41);
    uVar6 = quant_color(quant_level,(int)(auVar41._0_4_ + 0.5),auVar41._0_4_);
    *output = uVar6;
    uVar6 = quant_color(quant_level,(int)(fVar54 + 0.5),fVar54);
    output[1] = uVar6;
    uVar6 = '\0';
    break;
  case 2:
  case 3:
    auVar33 = vshufpd_avx(auVar29,auVar29,1);
    auVar33 = vinsertps_avx(auVar33,auVar41,0x9c);
    auVar41 = vhaddps_avx(auVar29,auVar41);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar27._0_4_ = (auVar33._0_4_ + auVar41._0_4_) * 0.33333334;
    auVar27._4_4_ = (auVar33._4_4_ + auVar41._4_4_) * 0.33333334;
    auVar27._8_4_ = (auVar33._8_4_ + auVar41._8_4_) * 0.33333334;
    auVar27._12_4_ = (auVar33._12_4_ + auVar41._12_4_) * 0.33333334;
    auVar41 = vmovshdup_avx(auVar27);
    bVar7 = auVar41._0_4_ < auVar27._0_4_;
    fVar32 = (auVar27._0_4_ + auVar41._0_4_) * 0.5;
    auVar40[1] = bVar7;
    auVar40[0] = bVar7;
    auVar40[2] = bVar7;
    auVar40[3] = bVar7;
    auVar40[4] = bVar7;
    auVar40[5] = bVar7;
    auVar40[6] = bVar7;
    auVar40[7] = bVar7;
    auVar40[8] = bVar7;
    auVar40[9] = bVar7;
    auVar40[10] = bVar7;
    auVar40[0xb] = bVar7;
    auVar40[0xc] = bVar7;
    auVar40[0xd] = bVar7;
    auVar40[0xe] = bVar7;
    auVar40[0xf] = bVar7;
    auVar41 = vpslld_avx(auVar40,0x1f);
    auVar34._4_4_ = fVar32;
    auVar34._0_4_ = fVar32;
    auVar34._8_4_ = fVar32;
    auVar34._12_4_ = fVar32;
    auVar41 = vblendvps_avx(auVar27,auVar34,auVar41);
    auVar28._0_4_ = (int)(auVar41._0_4_ + 0.5);
    auVar28._4_4_ = (int)(auVar41._4_4_ + 0.5);
    auVar28._8_4_ = (int)(auVar41._8_4_ + 0.5);
    auVar28._12_4_ = (int)(auVar41._12_4_ + 0.5);
    if (auVar28._4_4_ - auVar28._0_4_ < 0x801) {
      uVar15 = auVar28._0_4_ + 0x10 >> 5;
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      if (0x7fe < (int)uVar15) {
        uVar15 = 0x7ff;
      }
      uVar10 = (ulong)uVar13;
      bVar8 = color_unquant_to_uquant_tables[uVar10][uVar15 * 2 + 1 & 0xff];
      if (-1 < (char)bVar8) {
        iVar16 = auVar28._4_4_ + 0x10 >> 5;
        if (iVar16 < 1) {
          iVar16 = 0;
        }
        if (0x7fe < iVar16) {
          iVar16 = 0x7ff;
        }
        uVar14 = iVar16 - (uVar15 & 0x780 | (int)(char)bVar8);
        if ((uVar14 < 0x10) &&
           (uVar15 = uVar15 >> 3 & 0xf0,
           bVar19 = *(byte *)(uVar10 * 0x200 + 0x31c5a1 + (ulong)(uVar14 | uVar15) * 2),
           uVar15 == (bVar19 & 0xfffffff0))) goto LAB_00261893;
      }
      uVar14 = auVar28._0_4_ + 0x20 >> 6;
      uVar15 = 0;
      if (0 < (int)uVar14) {
        uVar15 = uVar14;
      }
      if (0x3fe < (int)uVar15) {
        uVar15 = 0x3ff;
      }
      bVar8 = color_unquant_to_uquant_tables[uVar10][uVar15 * 2 & 0x1ff | 0x101];
      if ((char)bVar8 < '\0') {
        iVar23 = auVar28._4_4_ + 0x20 >> 6;
        iVar16 = 0;
        if (0 < iVar23) {
          iVar16 = iVar23;
        }
        if (0x3fe < iVar16) {
          iVar16 = 0x3ff;
        }
        uVar14 = iVar16 - (bVar8 & 0x7f | uVar15 & 0x380);
        if ((uVar14 < 0x20) &&
           (uVar15 = uVar15 >> 2 & 0xe0,
           bVar19 = *(byte *)(uVar10 * 0x200 + 0x31c5a1 + (ulong)(uVar14 | uVar15) * 2),
           uVar15 == (bVar19 & 0xffffffe0))) {
LAB_00261893:
          *output = bVar8;
          output[1] = bVar19;
          return '\x03';
        }
      }
    }
    auVar36._8_4_ = 0x80;
    auVar36._0_8_ = 0x8000000080;
    auVar36._12_4_ = 0x80;
    auVar41 = vpaddd_avx(auVar28,auVar36);
    auVar41 = vpsrad_avx(auVar41,8);
    auVar41 = vpmaxsd_avx(auVar41,(undefined1  [16])0x0);
    auVar46._8_4_ = 0xff;
    auVar46._0_8_ = 0xff000000ff;
    auVar46._12_4_ = 0xff;
    auVar29 = vpminsd_avx(auVar41,auVar46);
    auVar41 = vpslld_avx(auVar29,8);
    auVar33 = vpsubd_avx(auVar41,auVar28);
    auVar41 = vpinsrd_avx(auVar28,auVar28._4_4_ + 0x100,1);
    auVar51 = vpmulld_avx(auVar33,auVar33);
    auVar41 = vpsrad_avx(auVar41,8);
    auVar41 = vpmaxsd_avx(auVar41,(undefined1  [16])0x0);
    auVar33 = vpminsd_avx(auVar41,auVar46);
    auVar41 = vpslld_avx(auVar33,8);
    auVar41 = vpsubd_avx(auVar41,auVar28);
    auVar41 = vpaddd_avx(auVar41,_DAT_003206f0);
    auVar41 = vpmulld_avx(auVar41,auVar41);
    auVar41 = vphaddd_avx(auVar51,auVar41);
    bVar7 = auVar41._0_4_ < auVar41._8_4_;
    uVar15 = auVar33._4_4_;
    if (bVar7) {
      uVar15 = auVar29._0_4_;
    }
    uVar14 = auVar33._0_4_;
    if (bVar7) {
      uVar14 = auVar29._4_4_;
    }
    *output = *(uint8_t *)((ulong)uVar13 * 0x200 + 0x31c5a1 + (ulong)uVar15 * 2);
    output[1] = *(uint8_t *)((ulong)uVar13 * 0x200 + 0x31c5a1 + (ulong)uVar14 * 2);
    uVar6 = '\x02';
    break;
  case 4:
    auVar41 = vhaddps_avx(auVar53,auVar53);
    auVar51 = vshufpd_avx(auVar53,auVar53,1);
    auVar29 = vhaddps_avx(auVar33,auVar33);
    fVar32 = (auVar51._0_4_ + auVar41._0_4_) * 0.33333334;
    auVar41 = vshufpd_avx(auVar33,auVar33,1);
    fVar38 = (auVar41._0_4_ + auVar29._0_4_) * 0.33333334;
    auVar41 = vshufps_avx(auVar53,auVar53,0xff);
    auVar29 = vshufps_avx(auVar33,auVar33,0xff);
    uVar15 = (uint)(fVar32 + 0.5);
    fVar54 = auVar41._0_4_;
    fVar52 = auVar29._0_4_;
    if (quant_level < QUANT_192) {
      uVar14 = (uint)(fVar54 + 0.5);
      lVar21 = (ulong)uVar13 * 0x200;
      bVar8 = *(byte *)(lVar21 + 0x31c5a1 + (ulong)((uVar15 & 0x7f) << 2));
      uVar13 = uVar15 * 2 & 0x100;
      iVar23 = (int)(fVar38 + 0.5);
      iVar1 = uVar13 + bVar8;
      iVar16 = (int)(fVar52 + 0.5);
      uVar20 = iVar23 * 2 - iVar1;
      if (0xffffff7f < uVar20 - 0x40) {
        bVar19 = *(byte *)(lVar21 + 0x31c5a1 + (ulong)((uVar14 & 0x7f) << 2));
        uVar24 = uVar14 * 2 & 0x100;
        iVar2 = uVar24 + bVar19;
        uVar22 = iVar16 * 2 - iVar2;
        if (0xffffff7f < uVar22 - 0x40) {
          uVar13 = uVar13 >> 1 | uVar20 & 0x7f;
          bVar11 = *(byte *)(lVar21 + 0x31c5a1 + (ulong)uVar13 * 2);
          if ((uVar13 ^ bVar11) < 0x40) {
            uVar13 = uVar24 >> 1 | uVar22 & 0x7f;
            bVar4 = *(byte *)(lVar21 + 0x31c5a1 + (ulong)uVar13 * 2);
            if ((((uVar13 ^ bVar4) < 0x40) &&
                ((bVar11 & 0x7f) + iVar1 + ((int)((uint)bVar11 << 0x19) >> 0x1f & 0xffffff80U) <
                 0x200)) &&
               ((bVar4 & 0x7f) + iVar2 + ((int)((uint)bVar4 << 0x19) >> 0x1f & 0xffffff80U) < 0x200)
               ) {
              *output = bVar8;
              output[1] = bVar11;
              output[2] = bVar19;
              output[3] = bVar4;
              return '\x05';
            }
          }
        }
      }
    }
    else {
      iVar23 = (int)(fVar38 + 0.5);
      uVar14 = (uint)(fVar54 + 0.5);
      iVar16 = (int)(fVar52 + 0.5);
    }
    uVar6 = quant_color(quant_level,uVar15,fVar32);
    *output = uVar6;
    uVar6 = quant_color(quant_level,iVar23,fVar38);
    output[1] = uVar6;
    uVar6 = quant_color(quant_level,uVar14,fVar54);
    output[2] = uVar6;
    uVar6 = quant_color(quant_level,iVar16,fVar52);
    output[3] = uVar6;
    uVar6 = '\x04';
    break;
  case 6:
    color_00.m[2] = fVar32;
    color_00.m[3] = fVar38;
    color_00.m[0] = (float)(int)lVar39;
    color_00.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
    quantize_rgbs(color_00,output,quant_level);
    uVar6 = '\x06';
    break;
  case 7:
    auVar29 = auVar49._0_16_;
    auVar41 = vshufps_avx(auVar29,auVar29,0xff);
    auVar35._0_4_ = auVar41._0_4_ + color1.m[2];
    auVar35._4_4_ = auVar41._4_4_ + color1.m[3];
    auVar35._8_8_ = color1._16_8_;
    auVar29 = vshufps_avx(auVar29,auVar29,0xe9);
    auVar30._0_4_ = auVar29._0_4_ + auVar41._0_4_;
    auVar30._4_4_ = auVar29._4_4_ + auVar41._4_4_;
    auVar30._8_4_ = auVar29._8_4_ + auVar41._8_4_;
    auVar30._12_4_ = auVar29._12_4_ + auVar41._12_4_;
    auVar41 = vshufps_avx(auVar35,auVar30,0x4c);
    auVar41 = vshufps_avx(auVar41,auVar41,0x78);
    auVar41 = vmaxps_avx(auVar41,ZEXT416(0) << 0x20);
    auVar41 = vminps_avx(auVar41,auVar51);
    auVar29 = vmovshdup_avx(auVar41);
    auVar33 = vshufpd_avx(auVar41,auVar41,1);
    local_a8 = auVar33._0_4_;
    if (auVar41._0_4_ <= auVar29._0_4_) {
LAB_00261555:
      if (auVar29._0_4_ <= local_a8) {
        auVar29 = vpermilps_avx(auVar41,0xc6);
        auVar45 = ZEXT1664(auVar29);
        uVar13 = 2;
      }
      else {
        auVar29 = vpermilps_avx(auVar41,0xe1);
        auVar45 = ZEXT1664(auVar29);
        uVar13 = 1;
      }
    }
    else {
      uVar13 = 0;
      auVar45 = ZEXT1664(auVar41);
      if (auVar41._0_4_ <= local_a8) goto LAB_00261555;
    }
    auVar30 = auVar45._0_16_;
    auVar29 = vhsubps_avx(auVar30,auVar30);
    auVar33 = vshufpd_avx(auVar30,auVar30,1);
    fVar32 = auVar45._0_4_;
    auVar51 = vshufps_avx(auVar30,auVar30,0xff);
    auVar53 = vshufps_avx(auVar30,auVar30,0xe9);
    lVar21 = 0x3207d8;
    uVar15 = 0;
    for (lVar25 = 0; lVar25 != 0x14; lVar25 = lVar25 + 4) {
      fVar38 = *(float *)((long)&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::
                                 mode_cutoffs + lVar25 * 2);
      if (((auVar29._0_4_ <= fVar38) && (fVar32 - auVar33._0_4_ <= fVar38)) &&
         (auVar51._0_4_ <= *(float *)((long)&DAT_00320814 + lVar25 * 2))) {
        uVar14 = uVar15;
        if (lVar25 == 0x10) {
          uVar14 = uVar13;
        }
        iVar16 = 1 << (*(byte *)(lVar21 + -4) & 0x1f);
        fVar38 = *(float *)((long)&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::
                                   mode_scales + lVar25);
        fVar52 = *(float *)((long)&quantize_hdr_rgbo(vfloat4,unsigned_char*,quant_method)::
                                   mode_rscales + lVar25);
        uVar20 = (uint)(auVar45._0_4_ * fVar38 + 0.5);
        quantize_and_unquantize_retain_top_two_bits
                  (quant_level,(byte)(uVar14 << 6) | (byte)uVar20 & 0x3f,(uint8_t *)&color0_out);
        auVar42._8_4_ = 0x477fff00;
        auVar42._0_8_ = 0x477fff00477fff00;
        auVar42._12_4_ = 0x477fff00;
        fVar52 = (float)(int)((uint)(float)color0_out.m[0] & 0x3f | uVar20 & 0xffffffc0) * fVar52;
        auVar47._4_4_ = fVar52;
        auVar47._0_4_ = fVar52;
        auVar47._8_4_ = fVar52;
        auVar47._12_4_ = fVar52;
        auVar47 = vsubps_avx(auVar47,auVar53);
        auVar35 = vcmpps_avx(auVar42,auVar47,1);
        auVar47 = vmaxps_avx(auVar47,_DAT_00264480);
        auVar35 = vblendvps_avx(auVar47,auVar42,auVar35);
        if (((int)(auVar35._0_4_ * fVar38 + 0.5) < iVar16) &&
           ((int)(auVar35._4_4_ * fVar38 + 0.5) < iVar16)) {
          uVar6 = (*(code *)((long)&DAT_00320774 + (long)(int)(&DAT_00320774)[uVar15]))();
          return uVar6;
        }
        auVar45 = ZEXT1664(auVar30);
      }
      lVar21 = lVar21 + 0xc;
      uVar15 = uVar15 + 1;
    }
    uVar3 = vmovlps_avx(auVar41);
    color0_out.m[0]._0_4_ = (float)uVar3;
    color0_out.m[0]._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    color0_out.m[1]._0_4_ = local_a8;
    color0_out.m[1]._4_4_ = (float)vextractps_avx(auVar41,3);
    auVar43._8_4_ = 0x477dfc00;
    auVar43._0_8_ = 0x477dfc00477dfc00;
    auVar43._12_4_ = 0x477dfc00;
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      auVar41 = ZEXT416(*(uint *)((long)color0_out.m + lVar21 * 4));
      auVar29 = vmaxss_avx(auVar41,ZEXT816(0) << 0x20);
      auVar41 = vcmpss_avx(SUB6416(ZEXT464(0x477dfc00),0),auVar41,1);
      auVar41 = vblendvps_avx(auVar29,auVar43,auVar41);
      *(float *)((long)color0_out.m + lVar21 * 4) = auVar41._0_4_;
      fVar32 = auVar41._0_4_ * 0.001953125 + 0.5;
      *(int *)((long)color1_out.m + lVar21 * 4) = (int)fVar32;
      auVar41 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar32));
      *(float *)((long)color1_out2.m + lVar21 * 4) = auVar41._0_4_ * 512.0;
    }
    auVar44._4_4_ = (undefined4)color1_out2.m[1];
    auVar44._0_4_ = color1_out2.m[0]._4_4_;
    auVar44._8_8_ = 0;
    auVar48._4_4_ = (float)color0_out.m[1];
    auVar48._0_4_ = color0_out.m[0]._4_4_;
    auVar48._8_8_ = 0;
    auVar29 = vsubps_avx(auVar44,auVar48);
    auVar41 = vmovshdup_avx(auVar29);
    auVar41 = ZEXT416((uint)((((float)color1_out2.m[0] - (float)color0_out.m[0]) + auVar29._0_4_ +
                             auVar41._0_4_) * 0.33333334 + color0_out.m[1]._4_4_));
    auVar29 = vmaxss_avx(auVar41,ZEXT816(0) << 0x20);
    auVar41 = vcmpss_avx(SUB6416(ZEXT464(0x477dfc00),0),auVar41,1);
    auVar37._8_4_ = 0x42fefc00;
    auVar37._0_8_ = 0x42fefc0042fefc00;
    auVar37._12_4_ = 0x42fefc00;
    auVar41 = vblendvps_avx(ZEXT416((uint)(auVar29._0_4_ * 0.001953125 + 0.5)),auVar37,auVar41);
    auVar31._4_4_ = (undefined4)color1_out.m[1];
    auVar31._0_4_ = color1_out.m[0]._4_4_;
    auVar31._8_8_ = 0;
    auVar29 = vpshufd_avx(auVar31,0x50);
    auVar29 = vpblendd_avx2(auVar29,ZEXT416((uint)(float)color1_out.m[0]),1);
    auVar41 = vpinsrd_avx(auVar29,(int)auVar41._0_4_,3);
    auVar41 = vpand_avx(auVar41,_DAT_00320700);
    auVar29 = vpmovzxbd_avx(ZEXT416(0x8080c0));
    auVar29 = vpinsrd_avx(auVar29,((uint)(float)color1_out.m[0] & 0x40) * 2,3);
    alVar5 = (__m128i)vpor_avx(auVar41,auVar29);
    color0_out2.m[0] = alVar5[0];
    color0_out2.m[1] = alVar5[1];
    for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
      quantize_and_unquantize_retain_top_four_bits
                (quant_level,*(uint8_t *)((long)color0_out2.m + lVar21 * 4),output + lVar21);
    }
    uVar6 = '\a';
    break;
  case 8:
    if (quant_level < QUANT_192) {
      color0_02.m[2] = fVar32;
      color0_02.m[3] = fVar38;
      color0_02.m[0] = fVar52;
      color0_02.m[1] = fVar54;
      bVar7 = try_quantize_rgb_delta_blue_contract
                        (color0_02,color1,&color0_out,&color1_out,quant_level);
      if (bVar7) {
        pvVar18 = &color0_out2;
        pvVar17 = &color1_out2;
        input0.m[1] = (longlong)pvVar17;
        input0.m[0] = (longlong)pvVar18;
        input1.m[1] = (longlong)puVar12;
        input1.m[0] = extraout_RDX;
        rgba_delta_unpack(input0,input1,in_R8,in_R9);
        vVar55 = color0_out2;
        uquant0.m[2] = fVar32;
        uquant0.m[3] = fVar38;
        uquant0.m[0] = fVar52;
        uquant0.m[1] = fVar54;
        uquant1.m[2] = (float)color1_out2.m[0];
        uquant1.m[3] = (float)color1_out2.m[0]._4_4_;
        uquant1.m[0] = (float)(undefined4)color0_out2.m[0];
        uquant1.m[1] = (float)color0_out2.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT412(color1_out2.m[1]._4_4_,
                                     CONCAT48((undefined4)color1_out2.m[1],
                                              CONCAT44(color1_out2.m[0]._4_4_,
                                                       (float)color1_out2.m[0]))));
        quant0.m[1] = (longlong)pvVar17;
        quant0.m[0] = (longlong)pvVar18;
        quant1.m[1] = (longlong)puVar12;
        quant1.m[0] = extraout_RDX_00;
        lVar39 = color0_out2.m[0];
        color0_out2 = vVar55;
        local_178 = get_rgba_encoding_error(uquant0,uquant1,quant0,quant1);
        uVar6 = '\t';
      }
      else {
        local_178 = 1e+30;
        uVar6 = '\0';
      }
      color0_10.m[2] = fVar32;
      color0_10.m[3] = fVar38;
      color0_10.m[0] = fVar52;
      color0_10.m[1] = fVar54;
      color1_06.m._8_8_ = auVar49._0_8_;
      color1_06.m[0] = (float)(int)lVar39;
      color1_06.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
      bVar7 = try_quantize_rgb_delta(color0_10,color1_06,&color0_out2,&color1_out2,quant_level);
      if (bVar7) {
        pvVar18 = &color0_unpack_1;
        pvVar17 = &color1_unpack_1;
        input0_03.m[1] = (longlong)pvVar17;
        input0_03.m[0] = (longlong)pvVar18;
        input1_04.m[1] = (longlong)puVar12;
        input1_04.m[0] = extraout_RDX_09;
        rgba_delta_unpack(input0_03,input1_04,in_R8,in_R9);
        uquant0_04.m[2] = fVar32;
        uquant0_04.m[3] = fVar38;
        uquant0_04.m[0] = fVar52;
        uquant0_04.m[1] = fVar54;
        uquant1_04.m[2] = (float)(undefined4)color1_unpack_1.m[0];
        uquant1_04.m[3] = (float)color1_unpack_1.m[0]._4_4_;
        uquant1_04.m[0] = (float)(undefined4)color0_unpack_1.m[0];
        uquant1_04.m[1] = (float)color0_unpack_1.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT88(color1_unpack_1.m[1],color1_unpack_1.m[0]));
        quant0_04.m[1] = (longlong)pvVar17;
        quant0_04.m[0] = (longlong)pvVar18;
        quant1_04.m[1] = (longlong)puVar12;
        quant1_04.m[0] = extraout_RDX_10;
        lVar39 = color0_unpack_1.m[0];
        fVar26 = get_rgba_encoding_error(uquant0_04,uquant1_04,quant0_04,quant1_04);
        if (fVar26 < local_178) {
          color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
          color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
          color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
          color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
          color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
          color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
          color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
          color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
          uVar6 = '\t';
          local_178 = fVar26;
        }
      }
LAB_002626bb:
      color0_11.m[2] = fVar32;
      color0_11.m[3] = fVar38;
      color0_11.m[0] = fVar52;
      color0_11.m[1] = fVar54;
      color1_07.m._8_8_ = auVar49._0_8_;
      color1_07.m[0] = (float)(int)lVar39;
      color1_07.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
      bVar7 = try_quantize_rgb_blue_contract
                        (color0_11,color1_07,&color0_out2,&color1_out2,quant_level);
      if (bVar7) {
        pvVar18 = &color0_unpack_1;
        pvVar17 = &color1_unpack_1;
        input0_04.m[1] = (longlong)pvVar17;
        input0_04.m[0] = (longlong)pvVar18;
        input1_05.m[1] = (longlong)puVar12;
        input1_05.m[0] = extraout_RDX_11;
        rgba_unpack(input0_04,input1_05,in_R8,in_R9);
        uquant0_05.m[2] = fVar32;
        uquant0_05.m[3] = fVar38;
        uquant0_05.m[0] = fVar52;
        uquant0_05.m[1] = fVar54;
        uquant1_05.m[2] = (float)(undefined4)color1_unpack_1.m[0];
        uquant1_05.m[3] = (float)color1_unpack_1.m[0]._4_4_;
        uquant1_05.m[0] = (float)(undefined4)color0_unpack_1.m[0];
        uquant1_05.m[1] = (float)color0_unpack_1.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT88(color1_unpack_1.m[1],color1_unpack_1.m[0]));
        quant0_05.m[1] = (longlong)pvVar17;
        quant0_05.m[0] = (longlong)pvVar18;
        quant1_05.m[1] = (longlong)puVar12;
        quant1_05.m[0] = extraout_RDX_12;
        lVar39 = color0_unpack_1.m[0];
        fVar26 = get_rgba_encoding_error(uquant0_05,uquant1_05,quant0_05,quant1_05);
        if (fVar26 < local_178) {
          color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
          color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
          color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
          color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
          color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
          color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
          color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
          color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
          uVar6 = '\b';
          local_178 = fVar26;
        }
      }
    }
    else {
      local_178 = 1e+30;
      uVar6 = '\0';
      if (quant_level == QUANT_192) goto LAB_002626bb;
    }
    color0_12.m[2] = fVar32;
    color0_12.m[3] = fVar38;
    color0_12.m[0] = fVar52;
    color0_12.m[1] = fVar54;
    color1_08.m._8_8_ = auVar49._0_8_;
    color1_08.m[0] = (float)(int)lVar39;
    color1_08.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
    quantize_rgb(color0_12,color1_08,&color0_out2,&color1_out2,quant_level);
    pvVar18 = &color0_unpack_1;
    pvVar17 = &color1_unpack_1;
    input0_05.m[1] = (longlong)pvVar17;
    input0_05.m[0] = (longlong)pvVar18;
    input1_06.m[1] = (longlong)puVar12;
    input1_06.m[0] = extraout_RDX_13;
    rgba_unpack(input0_05,input1_06,in_R8,in_R9);
    uquant0_06.m[2] = fVar32;
    uquant0_06.m[3] = fVar38;
    uquant0_06.m[0] = fVar52;
    uquant0_06.m[1] = fVar54;
    uquant1_06.m[2] = (float)(undefined4)color1_unpack_1.m[0];
    uquant1_06.m[3] = (float)color1_unpack_1.m[0]._4_4_;
    uquant1_06.m[0] = (float)(undefined4)color0_unpack_1.m[0];
    uquant1_06.m[1] = (float)color0_unpack_1.m[0]._4_4_;
    quant0_06.m[1] = (longlong)pvVar17;
    quant0_06.m[0] = (longlong)pvVar18;
    quant1_06.m[1] = (longlong)puVar12;
    quant1_06.m[0] = extraout_RDX_14;
    fVar32 = get_rgba_encoding_error(uquant0_06,uquant1_06,quant0_06,quant1_06);
    if (fVar32 < local_178) {
      color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
      color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
      color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
      color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
      color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
      color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
      color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
      color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
      uVar6 = '\b';
    }
    auVar33._4_4_ = color0_out.m[0]._4_4_;
    auVar33._0_4_ = (float)color0_out.m[0];
    auVar33._8_4_ = (float)color0_out.m[1];
    auVar33._12_4_ = color0_out.m[1]._4_4_;
    auVar53._4_4_ = color1_out.m[0]._4_4_;
    auVar53._0_4_ = (float)color1_out.m[0];
    auVar53._8_4_ = (undefined4)color1_out.m[1];
    auVar53._12_4_ = color1_out.m[1]._4_4_;
    auVar41 = vpunpcklbw_avx(auVar33,auVar53);
    auVar41 = vpshufd_avx(auVar41,0xe8);
    auVar41 = vpshuflw_avx(auVar41,0xe8);
    *(int *)output = auVar41._0_4_;
    output[4] = SUB41((float)color0_out.m[0],0);
    output[5] = SUB41((float)color1_out.m[0],0);
    break;
  case 10:
    auVar41 = vshufps_avx(auVar53,auVar53,0xff);
    auVar29 = vshufps_avx(auVar33,auVar33,0xff);
    uVar6 = quant_color(quant_level,(int)(auVar41._0_4_ + 0.5),auVar41._0_4_);
    output[4] = uVar6;
    local_188 = auVar29._0_4_;
    auVar45 = ZEXT464((uint)(local_188 + 0.5));
    uVar6 = quant_color(quant_level,(int)(local_188 + 0.5),local_188);
    output[5] = uVar6;
    color.m._8_8_ = auVar45._0_8_;
    color.m[0] = (float)(int)lVar39;
    color.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
    quantize_rgbs(color,output,quant_level);
    uVar6 = '\n';
    break;
  case 0xb:
    color0_05.m[2] = (float)(int)color0_00.m._8_8_;
    color0_05.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_05.m[0] = (float)(int)color0_00.m._0_8_;
    color0_05.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    quantize_hdr_rgb(color0_05,color1,output,quant_level);
    uVar6 = '\v';
    break;
  case 0xc:
    auVar41 = vshufps_avx(auVar53,auVar53,0xff);
    auVar29 = vshufps_avx(auVar33,auVar33,0xff);
    a1_1 = auVar29._0_4_;
    a0_1 = auVar41._0_4_;
    if (quant_level < QUANT_192) {
      color0_03.m[2] = fVar32;
      color0_03.m[3] = fVar38;
      color0_03.m[0] = fVar52;
      color0_03.m[1] = fVar54;
      bVar7 = try_quantize_rgb_delta_blue_contract
                        (color0_03,color1,&color0_out,&color1_out,quant_level);
      local_178 = 1e+30;
      if ((bVar7) &&
         (color0_04.m[2] = fVar52, color0_04.m[3] = fVar54, color0_04.m[0] = fVar32,
         color0_04.m[1] = fVar38, color1_01.m._8_8_ = auVar49._0_8_,
         color1_01.m[0] = (float)(int)lVar39, color1_01.m[1] = (float)(int)((ulong)lVar39 >> 0x20),
         bVar7 = try_quantize_alpha_delta(color0_04,color1_01,&color0_out,&color1_out,quant_level),
         bVar7)) {
        pvVar18 = &color0_out2;
        pvVar17 = &color1_out2;
        vVar55.m[1] = (longlong)pvVar17;
        vVar55.m[0] = (longlong)pvVar18;
        input1_00.m[1] = (longlong)puVar12;
        input1_00.m[0] = extraout_RDX_01;
        rgba_delta_unpack(vVar55,input1_00,in_R8,in_R9);
        vVar55 = color0_out2;
        uquant0_00.m[2] = fVar32;
        uquant0_00.m[3] = fVar38;
        uquant0_00.m[0] = fVar52;
        uquant0_00.m[1] = fVar54;
        uquant1_00.m[2] = (float)color1_out2.m[0];
        uquant1_00.m[3] = (float)color1_out2.m[0]._4_4_;
        uquant1_00.m[0] = (float)(undefined4)color0_out2.m[0];
        uquant1_00.m[1] = (float)color0_out2.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT412(color1_out2.m[1]._4_4_,
                                     CONCAT48((undefined4)color1_out2.m[1],
                                              CONCAT44(color1_out2.m[0]._4_4_,
                                                       (float)color1_out2.m[0]))));
        quant0_00.m[1] = (longlong)pvVar17;
        quant0_00.m[0] = (longlong)pvVar18;
        quant1_00.m[1] = (longlong)puVar12;
        quant1_00.m[0] = extraout_RDX_02;
        lVar39 = color0_out2.m[0];
        color0_out2 = vVar55;
        local_178 = get_rgba_encoding_error(uquant0_00,uquant1_00,quant0_00,quant1_00);
        uVar6 = '\r';
      }
      else {
        uVar6 = '\0';
      }
      color0_06.m[2] = fVar32;
      color0_06.m[3] = fVar38;
      color0_06.m[0] = fVar52;
      color0_06.m[1] = fVar54;
      color1_02.m._8_8_ = auVar49._0_8_;
      color1_02.m[0] = (float)(int)lVar39;
      color1_02.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
      bVar7 = try_quantize_rgb_delta(color0_06,color1_02,&color0_out2,&color1_out2,quant_level);
      if ((bVar7) &&
         (color0_07.m[2] = fVar32, color0_07.m[3] = fVar38, color0_07.m[0] = fVar52,
         color0_07.m[1] = fVar54, color1_03.m._8_8_ = auVar49._0_8_,
         color1_03.m[0] = (float)(int)lVar39, color1_03.m[1] = (float)(int)((ulong)lVar39 >> 0x20),
         bVar7 = try_quantize_alpha_delta(color0_07,color1_03,&color0_out2,&color1_out2,quant_level)
         , bVar7)) {
        pvVar18 = &color0_unpack_1;
        pvVar17 = &color1_unpack_1;
        input0_00.m[1] = (longlong)pvVar17;
        input0_00.m[0] = (longlong)pvVar18;
        input1_01.m[1] = (longlong)puVar12;
        input1_01.m[0] = extraout_RDX_03;
        rgba_delta_unpack(input0_00,input1_01,in_R8,in_R9);
        uquant0_01.m[2] = fVar32;
        uquant0_01.m[3] = fVar38;
        uquant0_01.m[0] = fVar52;
        uquant0_01.m[1] = fVar54;
        uquant1_01.m[2] = (float)(undefined4)color1_unpack_1.m[0];
        uquant1_01.m[3] = (float)color1_unpack_1.m[0]._4_4_;
        uquant1_01.m[0] = (float)(undefined4)color0_unpack_1.m[0];
        uquant1_01.m[1] = (float)color0_unpack_1.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT88(color1_unpack_1.m[1],color1_unpack_1.m[0]));
        quant0_01.m[1] = (longlong)pvVar17;
        quant0_01.m[0] = (longlong)pvVar18;
        quant1_01.m[1] = (longlong)puVar12;
        quant1_01.m[0] = extraout_RDX_04;
        lVar39 = color0_unpack_1.m[0];
        fVar26 = get_rgba_encoding_error(uquant0_01,uquant1_01,quant0_01,quant1_01);
        if (fVar26 < local_178) {
          color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
          color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
          color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
          color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
          color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
          color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
          color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
          color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
          uVar6 = '\r';
          local_178 = fVar26;
        }
      }
LAB_00261e6f:
      color0_08.m[2] = fVar32;
      color0_08.m[3] = fVar38;
      color0_08.m[0] = fVar52;
      color0_08.m[1] = fVar54;
      color1_04.m._8_8_ = auVar49._0_8_;
      color1_04.m[0] = (float)(int)lVar39;
      color1_04.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
      bVar7 = try_quantize_rgb_blue_contract
                        (color0_08,color1_04,&color0_out2,&color1_out2,quant_level);
      if (bVar7) {
        color0_out2.m[1]._4_1_ = quant_color(quant_level,(int)(a1_1 + 0.5),a1_1);
        color0_out2.m[1]._5_3_ = 0;
        bVar8 = quant_color(quant_level,(int)(a0_1 + 0.5),a0_1);
        color1_out2.m[1]._4_4_ = (uint)bVar8;
        pvVar18 = &color0_unpack_1;
        pvVar17 = &color1_unpack_1;
        input0_01.m[1] = (longlong)pvVar17;
        input0_01.m[0] = (longlong)pvVar18;
        input1_02.m[1] = (longlong)puVar12;
        input1_02.m[0] = extraout_RDX_05;
        rgba_unpack(input0_01,input1_02,in_R8,in_R9);
        uquant0_02.m[2] = fVar32;
        uquant0_02.m[3] = fVar38;
        uquant0_02.m[0] = fVar52;
        uquant0_02.m[1] = fVar54;
        uquant1_02.m[2] = (float)(undefined4)color1_unpack_1.m[0];
        uquant1_02.m[3] = (float)color1_unpack_1.m[0]._4_4_;
        uquant1_02.m[0] = (float)(undefined4)color0_unpack_1.m[0];
        uquant1_02.m[1] = (float)color0_unpack_1.m[0]._4_4_;
        auVar49 = ZEXT1664(CONCAT88(color1_unpack_1.m[1],color1_unpack_1.m[0]));
        quant0_02.m[1] = (longlong)pvVar17;
        quant0_02.m[0] = (longlong)pvVar18;
        quant1_02.m[1] = (longlong)puVar12;
        quant1_02.m[0] = extraout_RDX_06;
        lVar39 = color0_unpack_1.m[0];
        fVar26 = get_rgba_encoding_error(uquant0_02,uquant1_02,quant0_02,quant1_02);
        if (fVar26 < local_178) {
          color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
          color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
          color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
          color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
          color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
          color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
          color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
          color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
          uVar6 = '\f';
          local_178 = fVar26;
        }
      }
    }
    else {
      local_178 = 1e+30;
      uVar6 = '\0';
      if (quant_level == QUANT_192) goto LAB_00261e6f;
    }
    color0_09.m[2] = fVar32;
    color0_09.m[3] = fVar38;
    color0_09.m[0] = fVar52;
    color0_09.m[1] = fVar54;
    color1_05.m._8_8_ = auVar49._0_8_;
    color1_05.m[0] = (float)(int)lVar39;
    color1_05.m[1] = (float)(int)((ulong)lVar39 >> 0x20);
    quantize_rgb(color0_09,color1_05,&color0_out2,&color1_out2,quant_level);
    uVar9 = quant_color(quant_level,(int)(a0_1 + 0.5),a0_1);
    color0_out2.m[1]._4_1_ = uVar9;
    color0_out2.m[1]._5_3_ = 0;
    bVar8 = quant_color(quant_level,(int)(a1_1 + 0.5),a1_1);
    color1_out2.m[1]._4_4_ = (uint)bVar8;
    pvVar18 = &color0_unpack_1;
    pvVar17 = &color1_unpack_1;
    input0_02.m[1] = (longlong)pvVar17;
    input0_02.m[0] = (longlong)pvVar18;
    input1_03.m[1] = (longlong)puVar12;
    input1_03.m[0] = extraout_RDX_07;
    rgba_unpack(input0_02,input1_03,in_R8,in_R9);
    uquant0_03.m[2] = fVar32;
    uquant0_03.m[3] = fVar38;
    uquant0_03.m[0] = fVar52;
    uquant0_03.m[1] = fVar54;
    uquant1_03.m[2] = (float)(undefined4)color1_unpack_1.m[0];
    uquant1_03.m[3] = (float)color1_unpack_1.m[0]._4_4_;
    uquant1_03.m[0] = (float)(undefined4)color0_unpack_1.m[0];
    uquant1_03.m[1] = (float)color0_unpack_1.m[0]._4_4_;
    quant0_03.m[1] = (longlong)pvVar17;
    quant0_03.m[0] = (longlong)pvVar18;
    quant1_03.m[1] = (longlong)puVar12;
    quant1_03.m[0] = extraout_RDX_08;
    fVar32 = get_rgba_encoding_error(uquant0_03,uquant1_03,quant0_03,quant1_03);
    if (fVar32 < local_178) {
      color0_out.m[0]._0_4_ = (float)color0_out2.m[0];
      color0_out.m[0]._4_4_ = color0_out2.m[0]._4_4_;
      color0_out.m[1]._0_4_ = (float)color0_out2.m[1];
      color0_out.m[1]._4_4_ = color0_out2.m[1]._4_4_;
      color1_out.m[0]._0_4_ = (float)color1_out2.m[0];
      color1_out.m[0]._4_4_ = color1_out2.m[0]._4_4_;
      color1_out.m[1]._0_4_ = (undefined4)color1_out2.m[1];
      color1_out.m[1]._4_4_ = color1_out2.m[1]._4_4_;
      uVar6 = '\f';
    }
    auVar29._4_4_ = color0_out.m[0]._4_4_;
    auVar29._0_4_ = (float)color0_out.m[0];
    auVar29._8_4_ = (float)color0_out.m[1];
    auVar29._12_4_ = color0_out.m[1]._4_4_;
    auVar41._4_4_ = color1_out.m[0]._4_4_;
    auVar41._0_4_ = (float)color1_out.m[0];
    auVar41._8_4_ = (undefined4)color1_out.m[1];
    auVar41._12_4_ = color1_out.m[1]._4_4_;
    auVar41 = vpshufb_avx(auVar41,SUB6416(ZEXT464(0xc080400),0));
    auVar29 = vpshufb_avx(auVar29,SUB6416(ZEXT464(0xc080400),0));
    auVar41 = vpunpcklbw_avx(auVar29,auVar41);
    *(long *)output = auVar41._0_8_;
    break;
  case 0xe:
    auVar29 = vshufps_avx(auVar29,auVar29,0xff);
    auVar29 = ZEXT416((uint)(auVar29._0_4_ * 0.0038910506));
    auVar33 = vmaxss_avx(auVar29,ZEXT816(0) << 0x40);
    auVar51 = SUB6416(ZEXT464(0x437f0000),0);
    auVar29 = vcmpss_avx(auVar51,auVar29,1);
    auVar29 = vblendvps_avx(auVar33,auVar51,auVar29);
    auVar41 = vshufps_avx(auVar41,auVar41,0xff);
    auVar50 = ZEXT1664(auVar41);
    auVar41 = ZEXT416((uint)(auVar41._0_4_ * 0.0038910506));
    auVar33 = vmaxss_avx(auVar41,ZEXT816(0) << 0x40);
    auVar45 = ZEXT1664(auVar33);
    auVar41 = vcmpss_avx(auVar51,auVar41,1);
    auVar41 = vblendvps_avx(auVar33,auVar51,auVar41);
    uVar6 = quant_color(quant_level,(int)(auVar29._0_4_ + 0.5),auVar29._0_4_);
    output[6] = uVar6;
    local_178 = auVar41._0_4_;
    uVar6 = quant_color(quant_level,(int)(local_178 + 0.5),local_178);
    output[7] = uVar6;
    color1_00.m._0_8_ = auVar45._0_8_;
    color1_00.m._8_8_ = auVar50._0_8_;
    quantize_hdr_rgb(color0_00,color1_00,output,quant_level);
    uVar6 = '\x0e';
    break;
  case 0xf:
    uVar15 = 2;
    color0_01.m[2] = (float)(int)color0_00.m._8_8_;
    color0_01.m[3] = (float)(int)((ulong)color0_00.m._8_8_ >> 0x20);
    color0_01.m[0] = (float)(int)color0_00.m._0_8_;
    color0_01.m[1] = (float)(int)((ulong)color0_00.m._0_8_ >> 0x20);
    quantize_hdr_rgb(color0_01,color1,output,quant_level);
    auVar29 = vpermilps_avx(auVar29,0xff);
    auVar33 = vmaxss_avx(auVar29,ZEXT816(0) << 0x40);
    auVar29 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar29,1);
    auVar29 = vblendvps_avx(ZEXT416((uint)(auVar33._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar29);
    auVar41 = vpermilps_avx(auVar41,0xff);
    auVar33 = vmaxss_avx(auVar41,ZEXT816(0) << 0x40);
    auVar41 = vcmpss_avx(SUB6416(ZEXT464(0x477f0000),0),auVar41,1);
    auVar41 = vblendvps_avx(ZEXT416((uint)(auVar33._0_4_ + 0.5)),SUB6416(ZEXT464(0x477f0080),0),
                            auVar41);
    uVar10 = (ulong)uVar13;
    bVar8 = 4;
    uVar13 = 0;
    uVar14 = 0x80;
    for (; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
      uVar24 = 0x80 >> ((byte)uVar15 & 0x1f);
      uVar20 = (int)(uVar24 + (int)auVar29._0_4_) >> (bVar8 + 2 & 0x1f);
      bVar19 = *(byte *)(uVar10 * 0x200 + 0x31c5a1 + (ulong)(uVar13 & 0x80 | uVar20 & 0x7f) * 2);
      if (-1 < (char)((byte)uVar13 ^ bVar19)) {
        uVar22 = 0x20 >> ((byte)uVar15 & 0x1f);
        uVar24 = ((int)(uVar24 + (int)auVar41._0_4_) >> (bVar8 + 2 & 0x1f)) -
                 (bVar19 & 0x7f | uVar20 & 0xffffff80);
        if (((int)uVar24 < (int)uVar22 && SBORROW4(uVar24,-uVar22) == (int)(uVar24 + uVar22) < 0) &&
           (uVar20 = uVar24 & uVar22 * 2 - 1 | ((int)uVar20 >> 7) << (bVar8 & 0x1f) | uVar14 & 0x80,
           bVar11 = color_unquant_to_uquant_tables[uVar10][(int)(uVar20 * 2 + 1)],
           (*(uint *)(quantize_hdr_alpha(float,float,unsigned_char*,quant_method)::testbits +
                     (ulong)uVar15 * 4) & (uVar20 ^ bVar11)) == 0)) {
          output[6] = bVar19;
          goto LAB_00261ce7;
        }
      }
      bVar8 = bVar8 + 1;
      uVar14 = uVar14 - 0x40;
      uVar13 = uVar13 - 0x80;
    }
    output[6] = color_unquant_to_uquant_tables[uVar10]
                [(int)((int)auVar29._0_4_ + 0x100 >> 8 | 0x101)];
    bVar11 = color_unquant_to_uquant_tables[uVar10][(int)((int)auVar41._0_4_ + 0x100 >> 8 | 0x101)];
LAB_00261ce7:
    output[7] = bVar11;
    uVar6 = '\x0f';
  }
  return uVar6;
}

Assistant:

uint8_t pack_color_endpoints(
	vfloat4 color0,
	vfloat4 color1,
	vfloat4 rgbs_color,
	vfloat4 rgbo_color,
	int format,
	uint8_t* output,
	quant_method quant_level
) {
	assert(QUANT_6 <= quant_level && quant_level <= QUANT_256);

	// Clamp colors to a valid LDR range
	// Note that HDR has a lower max, handled in the conversion functions
	color0 = clamp(0.0f, 65535.0f, color0);
	color1 = clamp(0.0f, 65535.0f, color1);

	// Pre-scale the LDR value we need to the 0-255 quantizable range
	vfloat4 color0_ldr = color0 * (1.0f  / 257.0f);
	vfloat4 color1_ldr = color1 * (1.0f  / 257.0f);

	uint8_t retval = 0;
	float best_error = ERROR_CALC_DEFAULT;
	vint4 color0_out, color1_out;
	vint4 color0_out2, color1_out2;

	switch (format)
	{
	case FMT_RGB:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgb_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGB_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgb_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgb_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGB;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgb(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGB;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		break;

	case FMT_RGBA:
		if (quant_level <= QUANT_160)
		{
			if (try_quantize_rgba_delta_blue_contract(color0_ldr, color1_ldr, color0_out, color1_out, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out, color1_out, color0_unpack, color1_unpack);

				retval = FMT_RGBA_DELTA;
				best_error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			}

			if (try_quantize_rgba_delta(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_delta_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA_DELTA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		if (quant_level < QUANT_256)
		{
			if (try_quantize_rgba_blue_contract(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level))
			{
				vint4 color0_unpack;
				vint4 color1_unpack;
				rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

				float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
				if (error < best_error)
				{
					retval = FMT_RGBA;
					best_error = error;
					color0_out = color0_out2;
					color1_out = color1_out2;
				}
			}
		}

		{
			quantize_rgba(color0_ldr, color1_ldr, color0_out2, color1_out2, quant_level);

			vint4 color0_unpack;
			vint4 color1_unpack;
			rgba_unpack(color0_out2, color1_out2, color0_unpack, color1_unpack);

			float error = get_rgba_encoding_error(color0_ldr, color1_ldr, color0_unpack, color1_unpack);
			if (error < best_error)
			{
				retval =  FMT_RGBA;
				color0_out = color0_out2;
				color1_out = color1_out2;
			}
		}

		// TODO: Can we vectorize this?
		output[0] = static_cast<uint8_t>(color0_out.lane<0>());
		output[1] = static_cast<uint8_t>(color1_out.lane<0>());
		output[2] = static_cast<uint8_t>(color0_out.lane<1>());
		output[3] = static_cast<uint8_t>(color1_out.lane<1>());
		output[4] = static_cast<uint8_t>(color0_out.lane<2>());
		output[5] = static_cast<uint8_t>(color1_out.lane<2>());
		output[6] = static_cast<uint8_t>(color0_out.lane<3>());
		output[7] = static_cast<uint8_t>(color1_out.lane<3>());
		break;

	case FMT_RGB_SCALE:
		quantize_rgbs(rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE;
		break;

	case FMT_HDR_RGB_SCALE:
		quantize_hdr_rgbo(rgbo_color, output, quant_level);
		retval = FMT_HDR_RGB_SCALE;
		break;

	case FMT_HDR_RGB:
		quantize_hdr_rgb(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB;
		break;

	case FMT_RGB_SCALE_ALPHA:
		quantize_rgbs_alpha(color0_ldr, color1_ldr, rgbs_color, output, quant_level);
		retval = FMT_RGB_SCALE_ALPHA;
		break;

	case FMT_HDR_LUMINANCE_SMALL_RANGE:
	case FMT_HDR_LUMINANCE_LARGE_RANGE:
		if (try_quantize_hdr_luminance_small_range(color0, color1, output, quant_level))
		{
			retval = FMT_HDR_LUMINANCE_SMALL_RANGE;
			break;
		}
		quantize_hdr_luminance_large_range(color0, color1, output, quant_level);
		retval = FMT_HDR_LUMINANCE_LARGE_RANGE;
		break;

	case FMT_LUMINANCE:
		quantize_luminance(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE;
		break;

	case FMT_LUMINANCE_ALPHA:
		if (quant_level <= 18)
		{
			if (try_quantize_luminance_alpha_delta(color0_ldr, color1_ldr, output, quant_level))
			{
				retval = FMT_LUMINANCE_ALPHA_DELTA;
				break;
			}
		}
		quantize_luminance_alpha(color0_ldr, color1_ldr, output, quant_level);
		retval = FMT_LUMINANCE_ALPHA;
		break;

	case FMT_HDR_RGB_LDR_ALPHA:
		quantize_hdr_rgb_ldr_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGB_LDR_ALPHA;
		break;

	case FMT_HDR_RGBA:
		quantize_hdr_rgb_alpha(color0, color1, output, quant_level);
		retval = FMT_HDR_RGBA;
		break;
	}

	return retval;
}